

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.h
# Opt level: O1

void __thiscall TradeWrap::TradeWrap(TradeWrap *this,Trade *trade)

{
  (this->_account_id)._M_dataplus._M_p = (pointer)&(this->_account_id).field_2;
  (this->_account_id)._M_string_length = 0;
  (this->_account_id).field_2._M_local_buf[0] = '\0';
  (this->_code)._M_dataplus._M_p = (pointer)&(this->_code).field_2;
  (this->_code)._M_string_length = 0;
  (this->_code).field_2._M_local_buf[0] = '\0';
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_entrust_no)._M_dataplus._M_p = (pointer)&(this->_entrust_no).field_2;
  (this->_entrust_no)._M_string_length = 0;
  (this->_entrust_no).field_2._M_local_buf[0] = '\0';
  (this->_entrust_action)._M_dataplus._M_p = (pointer)&(this->_entrust_action).field_2;
  (this->_entrust_action)._M_string_length = 0;
  (this->_entrust_action).field_2._M_local_buf[0] = '\0';
  (this->_fill_no)._M_dataplus._M_p = (pointer)&(this->_fill_no).field_2;
  (this->_fill_no)._M_string_length = 0;
  (this->_fill_no).field_2._M_local_buf[0] = '\0';
  utf8_to_utf16(&trade->account_id,&this->_account_id);
  this->account_id = (this->_account_id)._M_dataplus._M_p;
  utf8_to_utf16(&trade->code,&this->_code);
  this->code = (this->_code)._M_dataplus._M_p;
  utf8_to_utf16(&trade->name,&this->_name);
  this->name = (this->_name)._M_dataplus._M_p;
  utf8_to_utf16(&trade->entrust_no,&this->_entrust_no);
  this->entrust_no = (this->_entrust_no)._M_dataplus._M_p;
  utf8_to_utf16(&trade->entrust_action,&this->_entrust_action);
  this->entrust_action = (this->_entrust_action)._M_dataplus._M_p;
  utf8_to_utf16(&trade->fill_no,&this->_fill_no);
  this->fill_no = (this->_fill_no)._M_dataplus._M_p;
  this->fill_size = trade->fill_size;
  this->fill_price = trade->fill_price;
  this->fill_date = trade->fill_date;
  this->fill_time = trade->fill_time;
  this->order_id = trade->order_id;
  return;
}

Assistant:

TradeWrap(const Trade* trade)
    {
        account_id     = _T( trade->account_id    , _account_id     );
        code           = _T( trade->code          , _code           );
        name           = _T( trade->name          , _name           );
        entrust_no     = _T( trade->entrust_no    , _entrust_no     );
        entrust_action = _T( trade->entrust_action, _entrust_action );
        fill_no        = _T( trade->fill_no       , _fill_no        );
        fill_size      = trade->fill_size           ;
        fill_price     = trade->fill_price          ;
        fill_date      = trade->fill_date           ;
        fill_time      = trade->fill_time           ;
        order_id       = trade->order_id            ;
    }